

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusConstrainedPOMDPPlanner.cpp
# Opt level: O1

QFunctionsDiscrete * __thiscall
PerseusConstrainedPOMDPPlanner::BackupStage
          (QFunctionsDiscrete *__return_storage_ptr__,PerseusConstrainedPOMDPPlanner *this,
          BeliefSet *S,QFunctionsDiscrete *Q)

{
  _func_int *p_Var1;
  pointer ppJVar2;
  pointer ppJVar3;
  pointer pvVar4;
  pointer pAVar5;
  pointer pAVar6;
  JointBeliefInterface *pJVar7;
  _Bit_type *p_Var8;
  ulong uVar9;
  double *pdVar10;
  pointer pdVar11;
  long lVar12;
  bool bVar13;
  int k;
  ulong uVar14;
  size_t sVar15;
  ulong uVar16;
  ostream *poVar17;
  undefined8 *puVar18;
  ulong uVar19;
  ulong uVar20;
  size_type sVar21;
  PlanningUnitMADPDiscrete *this_00;
  ulong uVar22;
  long lVar23;
  pointer this_01;
  ulong uVar24;
  size_t b;
  double dVar25;
  QFunctionsDiscrete *Q1;
  vector<bool,_std::allocator<bool>_> stillNeedToBeImproved;
  AlphaVector alpha;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  VB;
  vector<unsigned_int,_std::allocator<unsigned_int>_> numberOfImprovements;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  logicTable;
  GaoVectorSet Gao;
  int local_404;
  size_type local_3e0;
  undefined1 local_3c8 [16];
  pointer local_3b8;
  pointer local_3b0;
  double *pdStack_3a8;
  vector<bool,_std::allocator<bool>_> local_3a0;
  ValueFunctionPOMDPDiscrete local_378;
  Perseus *local_360;
  size_t local_358;
  AlphaVector local_350;
  pointer local_328;
  pointer pAStack_320;
  pointer local_310;
  pointer local_308;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2d8;
  vector<bool,_std::allocator<bool>_> local_2c0;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_298;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  undefined1 local_248 [16];
  pointer pAStack_238;
  bool bStack_230;
  bool bStack_22f;
  undefined6 uStack_22e;
  unsigned_long uStack_228;
  unsigned_long uStack_220;
  long lStack_218;
  long lStack_210;
  long lStack_208;
  long lStack_200;
  index iStack_1f8;
  index iStack_1f0;
  size_type local_1e8;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  **local_1d8;
  size_type local_1d0;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  local_b8;
  
  local_2f8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = (this->super_AlphaVectorConstrainedPOMDP)._vptr_AlphaVectorConstrainedPOMDP[-3];
  lVar23 = *(long *)(&(this->super_AlphaVectorConstrainedPOMDP).field_0x10 + (long)p_Var1);
  if (lVar23 == 0) {
    lVar23 = *(long *)(&(this->super_AlphaVectorConstrainedPOMDP).field_0x18 + (long)p_Var1);
  }
  ppJVar2 = (S->super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  ppJVar3 = (S->super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>)
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar14 = (**(code **)(**(long **)(lVar23 + 0x30) + 0x68))();
  p_Var1 = (this->super_AlphaVectorConstrainedPOMDP)._vptr_AlphaVectorConstrainedPOMDP[-3];
  this_00 = *(PlanningUnitMADPDiscrete **)
             (&(this->super_AlphaVectorConstrainedPOMDP).field_0x10 + (long)p_Var1);
  if (this_00 == (PlanningUnitMADPDiscrete *)0x0) {
    this_00 = *(PlanningUnitMADPDiscrete **)
               (&(this->super_AlphaVectorConstrainedPOMDP).field_0x18 + (long)p_Var1);
  }
  sVar15 = PlanningUnitMADPDiscrete::GetNrStates(this_00);
  local_3e0 = (long)ppJVar3 - (long)ppJVar2 >> 3;
  local_248[0] = 1;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_3a0,local_3e0,(bool *)local_248,(allocator_type *)&local_350);
  local_298.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248._0_8_ = local_248._0_8_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_2d8,local_3e0,(value_type_conflict1 *)local_248,(allocator_type *)&local_350);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector(__return_storage_ptr__,
           ((long)(Q->
                  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(Q->
                  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)local_248);
  local_378.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AlphaVector::AlphaVector(&local_350,sVar15);
  local_358 = sVar15;
  AlphaVectorPlanning::QFunctionsToValueFunction((ValueFunctionPOMDPDiscrete *)local_3c8,Q);
  pAStack_238 = local_378.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_248._8_8_ =
       local_378.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_248._0_8_ =
       local_378.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_378.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_3c8._0_8_;
  local_378.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_3c8._8_8_;
  local_378.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_3b8;
  local_3c8._0_8_ = (pointer)0x0;
  local_3c8._8_8_ = (pointer)0x0;
  local_3b8 = (pointer)0x0;
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)local_248);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)local_3c8);
  if (uVar14 != 0) {
    uVar16 = 0;
    do {
      pvVar4 = (__return_storage_ptr__->
               super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pAVar5 = pvVar4[uVar16].super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
               super__Vector_impl_data._M_start;
      pAVar6 = *(pointer *)
                ((long)&pvVar4[uVar16].super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>
                        ._M_impl.super__Vector_impl_data + 8);
      this_01 = pAVar5;
      if (pAVar6 != pAVar5) {
        do {
          AlphaVector::~AlphaVector(this_01);
          this_01 = this_01 + 1;
        } while (this_01 != pAVar6);
        *(pointer *)
         ((long)&pvVar4[uVar16].super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>.
                 _M_impl.super__Vector_impl_data + 8) = pAVar5;
      }
      pvVar4 = (Q->
               super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pvVar4[uVar16].super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
          super__Vector_impl_data._M_start ==
          *(pointer *)
           ((long)&pvVar4[uVar16].super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>.
                   _M_impl.super__Vector_impl_data + 8)) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_248);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pAStack_238,"Empty Q-function for action ",0x1c);
        std::ostream::_M_insert<unsigned_long>((ulong)&pAStack_238);
        puVar18 = (undefined8 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar18 = &PTR__E_0059bd80;
        puVar18[1] = puVar18 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar18 + 1),local_268,local_260 + local_268);
        __cxa_throw(puVar18,&E::typeinfo,E::~E);
      }
      BeliefValue::GetValues((vector<double,_std::allocator<double>_> *)local_248,S,pvVar4 + uVar16)
      ;
      std::
      vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
      ::emplace_back<std::vector<double,std::allocator<double>>>
                ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                  *)&local_2f8,(vector<double,_std::allocator<double>_> *)local_248);
      if ((pointer)local_248._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_248._0_8_,(long)pAStack_238 - local_248._0_8_);
      }
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::push_back(&local_298,&local_3a0);
      uVar16 = (ulong)((int)uVar16 + 1);
    } while (uVar16 < uVar14);
  }
  local_360 = (Perseus *)&(this->super_AlphaVectorConstrainedPOMDP).field_0x10;
  Perseus::BackupStageLeadIn((GaoVectorSet *)local_248,local_360,&local_378);
  local_3b0 = (pointer)0x0;
  pdStack_3a8 = (double *)0x0;
  local_3c8._0_8_ = (pointer)0x0;
  local_3c8._8_8_ = (pointer)0x0;
  if (ppJVar3 != ppJVar2) {
    uVar16 = local_3e0 + (local_3e0 == 0);
    sVar15 = local_358;
    do {
      std::vector<bool,_std::allocator<bool>_>::vector(&local_2c0,&local_3a0);
      k = Perseus::SampleNotImprovedBeliefIndex(local_360,&local_2c0,(int)local_3e0);
      if (local_2c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_2c0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_2c0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_2c0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_2c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_2c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_2c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_2c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_2c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      AlphaVectorConstrainedPOMDP::BeliefBackupQ
                ((VectorSet *)&local_328,&this->super_AlphaVectorConstrainedPOMDP,
                 (S->
                 super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[k],(GaoVectorSet *)local_248,&local_378)
      ;
      pdVar11 = local_310;
      pdVar10 = pdStack_3a8;
      local_3c8._0_8_ = local_328;
      local_3c8._8_8_ = pAStack_320;
      if (local_3b0 != local_310) {
        if (local_310 != (pointer)0x0) {
          pdStack_3a8 = __gnu_cxx::new_allocator<double>::allocate
                                  ((new_allocator<double> *)&local_3b8,(size_type)local_310,
                                   (void *)0x0);
        }
        if (local_3b0 != (pointer)0x0) {
          operator_delete(pdVar10,(long)local_3b0 << 3);
        }
        if (pdVar11 == (pointer)0x0) {
          pdStack_3a8 = (double *)0x0;
        }
        local_3b0 = pdVar11;
      }
      if (local_310 != (pointer)0x0) {
        memmove(pdStack_3a8,local_308,(long)local_310 << 3);
      }
      if (local_310 != (pointer)0x0) {
        operator_delete(local_308,(long)local_310 << 3);
      }
      if (uVar14 == 0) {
        local_404 = 0;
      }
      else {
        lVar23 = 0;
        uVar24 = 0;
        local_404 = 0;
        local_278 = (long)k;
        do {
          lVar12 = local_278;
          local_350._m_action = (Index)uVar24;
          if (sVar15 != 0) {
            uVar22 = 0;
            do {
              if ((ulong)((long)local_350._m_values.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)local_350._m_values.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3) <= (uVar22 & 0xffffffff)) {
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
              }
              local_350._m_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar22 & 0xffffffff] =
                   *(double *)((long)pdStack_3a8 + uVar22 * 8 + local_3c8._8_8_ * lVar23);
              uVar22 = uVar22 + 1;
            } while (sVar15 != uVar22);
          }
          pJVar7 = (S->
                   super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[local_278];
          dVar25 = (double)(**(code **)(*(long *)((long)&pJVar7->field_0x0 +
                                                 *(long *)((long)*pJVar7 + -0xb8)) + 0x80))
                                     ((long)&pJVar7->field_0x0 + *(long *)((long)*pJVar7 + -0xb8),
                                      &local_350._m_values);
          if (dVar25 < local_2f8.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar24].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar12]) {
            BeliefValue::GetMaximizingVector
                      ((AlphaVector *)&local_328,S,k,
                       (Q->
                       super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar24);
            AlphaVector::operator=(&local_350,(AlphaVector *)&local_328);
            AlphaVector::~AlphaVector((AlphaVector *)&local_328);
          }
          bVar13 = AlphaVectorPlanning::VectorIsInValueFunction
                             (&local_350,
                              (__return_storage_ptr__->
                              super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar24);
          if (!bVar13) {
            std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
                      ((__return_storage_ptr__->
                       super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar24,&local_350);
          }
          uVar22 = 0;
          local_270 = lVar23;
          do {
            uVar20 = uVar22 + 0x3f;
            if (-1 < (long)uVar22) {
              uVar20 = uVar22;
            }
            lVar23 = (long)uVar20 >> 6;
            uVar20 = (ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001);
            if ((local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [lVar23 + (uVar20 - 1)] >> (uVar22 & 0x3f) & 1) != 0) {
              BeliefValue::GetMaximizingVector
                        ((AlphaVector *)&local_328,S,(int)uVar22,
                         (__return_storage_ptr__->
                         super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar24);
              AlphaVector::operator=(&local_350,(AlphaVector *)&local_328);
              AlphaVector::~AlphaVector((AlphaVector *)&local_328);
              pJVar7 = (S->
                       super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar22];
              dVar25 = (double)(**(code **)(*(long *)((long)&pJVar7->field_0x0 +
                                                     *(long *)((long)*pJVar7 + -0xb8)) + 0x80))
                                         ((long)&pJVar7->field_0x0 +
                                          *(long *)((long)*pJVar7 + -0xb8),&local_350._m_values);
              uVar19 = 1L << (uVar22 & 0x3f);
              p_Var8 = local_298.
                       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar24].
                       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                       _M_start.super__Bit_iterator_base._M_p;
              uVar9 = p_Var8[lVar23 + uVar20 + 0xffffffffffffffff];
              if (((uVar9 & uVar19) != 0) &&
                 (local_2f8.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar24].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar22] + -1e-12 <= dVar25)) {
                p_Var8[lVar23 + uVar20 + 0xffffffffffffffff] = ~uVar19 & uVar9;
                local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar22] =
                     local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar22] + 1;
              }
              if (((local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                    [lVar23 + (uVar20 - 1)] & uVar19) != 0) &&
                 (uVar14 <= local_2d8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar22])) {
                local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                [lVar23 + (uVar20 - 1)] =
                     ~uVar19 & local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                               [lVar23 + (uVar20 - 1)];
                local_3e0 = local_3e0 - 1;
                local_404 = local_404 + 1;
              }
            }
            uVar22 = uVar22 + 1;
          } while (uVar16 != uVar22);
          uVar24 = uVar24 + 1;
          lVar23 = local_270 + 8;
          sVar15 = local_358;
        } while (uVar24 != uVar14);
      }
      if (-1 < *(int *)&(this->super_AlphaVectorConstrainedPOMDP).field_0x20) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Added vector for ",0x11);
        poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17," (",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17," improved ",10);
        poVar17 = (ostream *)std::ostream::operator<<((ostream *)poVar17,local_404);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17," nrNotImproved: ",0x10);
        poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
        std::ostream::put((char)poVar17);
        std::ostream::flush();
      }
    } while (local_3e0 != 0);
  }
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .index_base_list_.elems[0] = lStack_208;
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .index_base_list_.elems[1] = lStack_200;
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .origin_offset_ = iStack_1f8;
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .directional_offset_ = iStack_1f0;
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .num_elements_ = local_1e8;
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .base_ = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            **)local_248._0_8_;
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .storage_.ordering_.elems[0] = local_248._8_8_;
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .storage_.ordering_.elems[1] = (unsigned_long)pAStack_238;
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .storage_.ascending_.elems[0] = bStack_230;
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .storage_.ascending_.elems[1] = bStack_22f;
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .storage_._18_6_ = uStack_22e;
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .extent_list_.elems[0] = uStack_228;
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .extent_list_.elems[1] = uStack_220;
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .stride_list_.elems[0] = lStack_218;
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .stride_list_.elems[1] = lStack_210;
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::allocate_space(&local_b8);
  if (local_1e8 != 0) {
    sVar21 = 0;
    do {
      local_b8.base_[sVar21] = local_1d8[sVar21];
      sVar21 = sVar21 + 1;
    } while (local_1e8 != sVar21);
  }
  Perseus::BackupStageLeadOut(local_360,&local_b8);
  if (local_b8.base_ !=
      (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
       **)0x0) {
    operator_delete(local_b8.base_,local_b8.allocated_elements_ << 3);
  }
  if (local_3b0 != (pointer)0x0) {
    operator_delete(pdStack_3a8,(long)local_3b0 << 3);
  }
  if (local_1d8 !=
      (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
       **)0x0) {
    operator_delete(local_1d8,local_1d0 << 3);
  }
  AlphaVector::~AlphaVector(&local_350);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_378);
  if (local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&local_298);
  if (local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_2f8);
  return __return_storage_ptr__;
}

Assistant:

QFunctionsDiscrete
PerseusConstrainedPOMDPPlanner::BackupStage(const BeliefSet &S,
                                            const QFunctionsDiscrete &Q) const
{
    vector<vector<double> > VB;
    vector<double>  VBalpha; 
    
    size_t nrB=S.size(),
           nrNotImproved=nrB,
           nrA=GetPU()->GetNrJointActions(),
           nrS=GetPU()->GetNrStates(),
           k;
    vector<bool> stillNeedToBeImproved(nrB,true);
    vector<vector<bool> > logicTable;
    vector<unsigned int> numberOfImprovements(nrB,0);

    QFunctionsDiscrete Q1(Q.size());
    ValueFunctionPOMDPDiscrete V1;
    AlphaVector alpha(nrS);

#if PRUNE_QFUNCTIONS

    for(Index a = 0; a < nrA; ++a)
    {
      Q1[a] = AlphaVectorPlanning::Prune(Q[a]);
    }

    V1 = AlphaVectorPlanning::QFunctionsToValueFunction(Q1);
#else
    V1 = AlphaVectorPlanning::QFunctionsToValueFunction(Q);
#endif

    for(Index a = 0; a < nrA; ++a)
    {
        Q1[a].clear();
        if(Q[a].empty())
        {
            stringstream estream;
            estream << "Empty Q-function for action " << a;
            throw E(estream.str());
        }
        VB.push_back(BeliefValue::GetValues(S,Q[a]));
        logicTable.push_back(stillNeedToBeImproved);
    }

    GaoVectorSet Gao=BackupStageLeadIn(V1);

    VectorSet Gab;

    while(nrNotImproved > 0)
    {
        int nrImprovedByGab=0;

        // sample a belief index from the number of not improved beliefs
        k=SampleNotImprovedBeliefIndex(stillNeedToBeImproved,nrNotImproved);

        Gab = BeliefBackupQ(*S[k],Gao,V1);
        for(size_t a = 0; a < nrA; a++)
        {
            alpha.SetAction(a);
            for(size_t s=0;s < nrS;s++)
              alpha.SetValue(Gab(a,s),s);

            // check whether the alphas improve the value of S[k]
            double x=S[k]->InnerProduct(alpha.GetValues());
            // if not, get copy from old value function
            if(x<VB[a][k])
            {
                alpha=BeliefValue::GetMaximizingVector(S,k,Q[a]);
#if DEBUG_PerseusConstrainedPOMDPPlanner
                cout << "Getting n-1 vector for " << k << endl;
#endif
            }
            
            // add alphas to Q1
            if(!VectorIsInValueFunction(alpha,Q1[a]))
                Q1[a].push_back(alpha);

            for(size_t b=0;b < nrB;b++)
            {
                if(!stillNeedToBeImproved[b])
                    continue;

                alpha=BeliefValue::GetMaximizingVector(S,b,Q1[a]);
                x=S[b]->InnerProduct(alpha.GetValues());

                if(logicTable[a][b] && x >= VB[a][b] - Globals::REWARD_PRECISION)
                {
                    logicTable[a][b] = false;
                    numberOfImprovements[b]++;
                }
                
                if(stillNeedToBeImproved[b] && numberOfImprovements[b] >= nrA)
                {
                    stillNeedToBeImproved[b]=false;
                    nrNotImproved--;
                    nrImprovedByGab++;
                }
            }
        }
        // update which beliefs have been improved

        if(GetVerbose() >= 0)
          cout << "Added vector for " << k << " ("
               << " improved " << nrImprovedByGab << " nrNotImproved: " << nrNotImproved << ")" << endl;
    }

    BackupStageLeadOut(Gao);

    return(Q1);
}